

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::UCharsTrieElement::getString
          (UnicodeString *__return_storage_ptr__,UCharsTrieElement *this,UnicodeString *strings)

{
  short sVar1;
  uint uVar2;
  uint len;
  char16_t *pcVar3;
  uint uVar4;
  
  uVar2 = this->stringOffset;
  sVar1 = (strings->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar4 = (strings->fUnion).fFields.fLength;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  len = 0xffff;
  if (uVar2 < uVar4) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar3 = (strings->fUnion).fFields.fArray;
    }
    else {
      pcVar3 = (char16_t *)((long)&strings->fUnion + 2);
    }
    len = (uint)(ushort)pcVar3[(int)uVar2];
  }
  UnicodeString::tempSubString(__return_storage_ptr__,strings,uVar2 + 1,len);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString getString(const UnicodeString &strings) const {
        int32_t length=strings[stringOffset];
        return strings.tempSubString(stringOffset+1, length);
    }